

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplate.h
# Opt level: O3

bool __thiscall
GeneratedSaxParser::
ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
::textData(ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
           *this,ParserChar *text,size_t textLength)

{
  ulong uVar1;
  undefined1 uVar2;
  int iVar3;
  _Elt_pointer pEVar4;
  _Base_ptr p_Var5;
  INamespaceHandler *pIVar6;
  ElementFunctionMap *pEVar7;
  _Rb_tree_header *p_Var8;
  _Base_ptr UNRECOVERED_JUMPTABLE;
  
  if (this->mIgnoreElements == 0) {
    if (this->mUnknownElements == 0) {
      if (this->mNamespaceElements != 0) {
        pIVar6 = this->mActiveNamespaceHandler;
        goto LAB_006c010a;
      }
      pEVar4 = (this->super_ParserTemplateBase).mElementDataStack.
               super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pEVar4 == (this->super_ParserTemplateBase).mElementDataStack.
                    super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        return false;
      }
      if (pEVar4 == (this->super_ParserTemplateBase).mElementDataStack.
                    super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pEVar4 = (this->super_ParserTemplateBase).mElementDataStack.
                 super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      pEVar7 = &this->mElementFunctionMap;
      if (this->mCurrentElementFunctionMap != (ElementFunctionMap *)0x0) {
        pEVar7 = this->mCurrentElementFunctionMap;
      }
      UNRECOVERED_JUMPTABLE = (pEVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (UNRECOVERED_JUMPTABLE != (_Base_ptr)0x0) {
        uVar1 = pEVar4[-1].generatedElementHash;
        p_Var8 = &(pEVar7->_M_t)._M_impl.super__Rb_tree_header;
        p_Var5 = &p_Var8->_M_header;
        do {
          if (*(ulong *)(UNRECOVERED_JUMPTABLE + 1) >= uVar1) {
            p_Var5 = UNRECOVERED_JUMPTABLE;
          }
          UNRECOVERED_JUMPTABLE =
               (&UNRECOVERED_JUMPTABLE->_M_left)[*(ulong *)(UNRECOVERED_JUMPTABLE + 1) < uVar1];
        } while (UNRECOVERED_JUMPTABLE != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var5 != p_Var8) && (*(ulong *)(p_Var5 + 1) <= uVar1)) {
          UNRECOVERED_JUMPTABLE = p_Var5[1]._M_right;
          if (UNRECOVERED_JUMPTABLE == (_Base_ptr)0x0) {
            return false;
          }
          if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
            UNRECOVERED_JUMPTABLE =
                 *(_Base_ptr *)
                  (*(long *)((long)&(this->super_ParserTemplateBase).super_Parser._vptr_Parser +
                            *(long *)(p_Var5 + 2)) + -1 + (long)UNRECOVERED_JUMPTABLE);
          }
          uVar2 = (*(code *)UNRECOVERED_JUMPTABLE)();
          return (bool)uVar2;
        }
      }
    }
    else {
      pIVar6 = (INamespaceHandler *)this->mUnknownHandler;
      if (pIVar6 != (INamespaceHandler *)0x0) {
LAB_006c010a:
        iVar3 = (*(*(_func_int ***)pIVar6)[4])();
        return SUB41(iVar3,0);
      }
    }
  }
  return true;
}

Assistant:

bool ParserTemplate<DerivedClass, ImplClass>::textData(const ParserChar* text,
															  size_t textLength)
	{
        if ( mIgnoreElements > 0 )
        {
            return true;
        }
        if ( mUnknownElements > 0 )
        {
            if ( mUnknownHandler != 0 )
            {
                return mUnknownHandler->textData( text, textLength );
            }
            else
            {
                return true;
            }
        }
        if ( mNamespaceElements > 0 )
        {
            return mActiveNamespaceHandler->textData( text, textLength );
        }

        if ( mElementDataStack.empty() )
            return false;
        ElementData elementData = mElementDataStack.back();
        typename ElementFunctionMap::const_iterator it;

        const ElementFunctionMap* functionMapToUse;
        if ( mCurrentElementFunctionMap )
            functionMapToUse = mCurrentElementFunctionMap;
        else
            functionMapToUse = &mElementFunctionMap;
		it = functionMapToUse->find(elementData.generatedElementHash);
		if ( it == functionMapToUse->end() )
			return true;
		const FunctionStruct& functions = it->second;

		if ( !functions.textDataFunction || !(static_cast<DerivedClass*>(this)->*functions.textDataFunction)(text, textLength) )
			return false;

		return true;
	}